

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayingState.cpp
# Opt level: O1

void PlayingState::CmdUnWield
               (string *input,shared_ptr<Connection> *connection,shared_ptr<GameData> *game_data)

{
  pointer pcVar1;
  int iVar2;
  ostream *poVar3;
  long lVar4;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  shared_ptr<Item> off;
  shared_ptr<Player> player;
  string match;
  stringstream ss;
  Item *local_2a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2a0;
  Player *local_298;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_290;
  string local_288;
  shared_ptr<Item> local_268;
  shared_ptr<Item> local_258;
  shared_ptr<Item> local_248;
  shared_ptr<Item> local_238;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_228;
  string local_210;
  string local_1f0;
  undefined1 *local_1d0 [2];
  undefined1 local_1c0 [16];
  undefined1 local_1b0 [32];
  undefined1 *local_190 [2];
  undefined1 local_180 [80];
  ios_base local_130 [264];
  
  Connection::GetPlayer
            ((connection->super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  local_1b0._0_8_ = local_1b0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"main","");
  local_190[0] = local_180;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"off","");
  __l._M_len = 2;
  __l._M_array = (iterator)local_1b0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_228,__l,(allocator_type *)&local_288);
  pcVar1 = (input->_M_dataplus)._M_p;
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_210,pcVar1,pcVar1 + input->_M_string_length);
  Utils::FindMatch(&local_1f0,&local_228,&local_210);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_228);
  lVar4 = 0;
  do {
    if (local_180 + lVar4 != *(undefined1 **)((long)local_190 + lVar4)) {
      operator_delete(*(undefined1 **)((long)local_190 + lVar4));
    }
    lVar4 = lVar4 + -0x20;
  } while (lVar4 != -0x40);
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b0);
  iVar2 = std::__cxx11::string::compare((char *)&local_1f0);
  if (iVar2 == 0) {
    Player::GetMainHand(local_298);
    if (local_2a8 == (Item *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b0 + 0x10),"Nothing to unwield",0x12);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b0 + 0x10),Format::NL_abi_cxx11_._M_dataplus._M_p,
                 Format::NL_abi_cxx11_._M_string_length);
    }
    else {
      local_238.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      local_238.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      Player::SetMainHand(local_298,&local_238);
      if (local_238.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_238.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ;
      }
      local_258.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = local_2a0;
      if (local_2a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_2a0->_M_use_count = local_2a0->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_2a0->_M_use_count = local_2a0->_M_use_count + 1;
        }
      }
      ItemContainer::AddItem(&local_298->super_ItemContainer,&local_258);
      if (local_258.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_258.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b0 + 0x10),"Unwielded ",10);
      Item::GetItemName_abi_cxx11_(&local_288,local_2a8);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)(local_1b0 + 0x10),local_288._M_dataplus._M_p,
                          local_288._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,Format::NL_abi_cxx11_._M_dataplus._M_p,
                 Format::NL_abi_cxx11_._M_string_length);
LAB_0014f51a:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != &local_288.field_2) {
        operator_delete(local_288._M_dataplus._M_p);
      }
    }
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)&local_1f0);
    if (iVar2 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b0 + 0x10),"Please indicate <main> or <off> hand",0x24);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b0 + 0x10),Format::NL_abi_cxx11_._M_dataplus._M_p,
                 Format::NL_abi_cxx11_._M_string_length);
      goto LAB_0014f53c;
    }
    Player::GetOffHand(local_298);
    if (local_2a8 != (Item *)0x0) {
      local_248.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      local_248.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      Player::SetOffHand(local_298,&local_248);
      if (local_248.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_248.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ;
      }
      local_268.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = local_2a0;
      if (local_2a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_2a0->_M_use_count = local_2a0->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_2a0->_M_use_count = local_2a0->_M_use_count + 1;
        }
      }
      ItemContainer::AddItem(&local_298->super_ItemContainer,&local_268);
      if (local_268.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_268.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b0 + 0x10),"Unwielded ",10);
      Item::GetItemName_abi_cxx11_(&local_288,local_2a8);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)(local_1b0 + 0x10),local_288._M_dataplus._M_p,
                          local_288._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,Format::NL_abi_cxx11_._M_dataplus._M_p,
                 Format::NL_abi_cxx11_._M_string_length);
      goto LAB_0014f51a;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b0 + 0x10),"Nothing to unwield",0x12);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b0 + 0x10),Format::NL_abi_cxx11_._M_dataplus._M_p,
               Format::NL_abi_cxx11_._M_string_length);
  }
  if (local_2a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2a0);
  }
LAB_0014f53c:
  std::__cxx11::stringbuf::str();
  (**(local_298->super_Entity)._vptr_Entity)(local_298,local_1d0);
  if (local_1d0[0] != local_1c0) {
    operator_delete(local_1d0[0]);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b0);
  std::ios_base::~ios_base(local_130);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p);
  }
  if (local_290 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_290);
  }
  return;
}

Assistant:

void PlayingState::CmdUnWield(const std::string &input, std::shared_ptr<Connection> connection,
                              std::shared_ptr<GameData> game_data) {
    auto player = connection->GetPlayer();
    auto match = Utils::FindMatch({"main", "off"}, input);
    std::stringstream ss;
    if(match == "main") {
        auto main = player->GetMainHand();
        if (main != nullptr) {
            player->SetMainHand(nullptr);
            player->AddItem(main);
            ss << "Unwielded " << main->GetItemName() << Format::NL;
        } else {
            ss << "Nothing to unwield" << Format::NL;
        }
    }
    else if(match == "off") {
        auto off = player->GetOffHand();
        if(off != nullptr) {
            player->SetOffHand(nullptr);
            player->AddItem(off);
            ss << "Unwielded " << off->GetItemName() << Format::NL;
        } else {
            ss << "Nothing to unwield" << Format::NL;
        }
    }
    else {
        ss << "Please indicate <main> or <off> hand" << Format::NL;
    }
    player->Send(ss.str());
}